

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

ktx_error_code_e ktxHashList_FindEntry(ktxHashList *pHead,char *key,ktxHashListEntry **ppEntry)

{
  ktxHashList pkVar1;
  UT_hash_table *pUVar2;
  UT_hash_handle *pUVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ktx_error_code_e kVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ktxHashListEntry *pkVar15;
  
  kVar9 = KTX_INVALID_VALUE;
  if (key != (char *)0x0 && pHead != (ktxHashList *)0x0) {
    pkVar1 = *pHead;
    kVar9 = KTX_NOT_FOUND;
    if (pkVar1 != (ktxHashList)0x0) {
      sVar4 = strlen(key);
      uVar14 = (uint)sVar4;
      pcVar5 = key;
      if (uVar14 < 0xc) {
        uVar8 = 0x9e3779b9;
        uVar10 = 0xfeedbeef;
        uVar12 = 0x9e3779b9;
        uVar6 = uVar14;
      }
      else {
        uVar10 = 0xfeedbeef;
        uVar12 = 0x9e3779b9;
        uVar11 = sVar4 & 0xffffffff;
        uVar8 = 0x9e3779b9;
        do {
          iVar7 = (uint)(byte)pcVar5[7] * 0x1000000 + pcVar5[6] * 0x10000 +
                  pcVar5[5] * 0x100 + (int)pcVar5[4] + uVar12;
          uVar6 = (uint)(byte)pcVar5[0xb] * 0x1000000 + pcVar5[10] * 0x10000 +
                  pcVar5[9] * 0x100 + (int)pcVar5[8] + uVar10;
          uVar12 = uVar6 >> 0xd ^
                   (((uint)(byte)pcVar5[3] * 0x1000000 + pcVar5[2] * 0x10000 +
                    pcVar5[1] * 0x100 + (int)*pcVar5 + uVar8) - iVar7) - uVar6;
          uVar10 = uVar12 << 8 ^ (iVar7 - uVar6) - uVar12;
          uVar8 = uVar10 >> 0xd ^ (uVar6 - uVar12) - uVar10;
          uVar6 = uVar8 >> 0xc ^ (uVar12 - uVar10) - uVar8;
          uVar10 = uVar6 << 0x10 ^ (uVar10 - uVar8) - uVar6;
          uVar13 = uVar10 >> 5 ^ (uVar8 - uVar6) - uVar10;
          uVar8 = uVar13 >> 3 ^ (uVar6 - uVar10) - uVar13;
          uVar12 = uVar8 << 10 ^ (uVar10 - uVar13) - uVar8;
          uVar10 = uVar12 >> 0xf ^ (uVar13 - uVar8) - uVar12;
          pcVar5 = pcVar5 + 0xc;
          uVar6 = (int)uVar11 - 0xc;
          uVar11 = (ulong)uVar6;
        } while (0xb < uVar6);
      }
      uVar10 = uVar10 + uVar14;
      switch(uVar6) {
      case 0xb:
        uVar10 = (uint)(byte)pcVar5[10] * 0x1000000 + uVar10;
      case 10:
        uVar10 = pcVar5[9] * 0x10000 + uVar10;
      case 9:
        uVar10 = pcVar5[8] * 0x100 + uVar10;
      case 8:
        uVar12 = (uint)(byte)pcVar5[7] * 0x1000000 + uVar12;
      case 7:
        uVar12 = pcVar5[6] * 0x10000 + uVar12;
      case 6:
        uVar12 = pcVar5[5] * 0x100 + uVar12;
      case 5:
        uVar12 = (int)pcVar5[4] + uVar12;
      case 4:
        uVar8 = (uint)(byte)pcVar5[3] * 0x1000000 + uVar8;
      case 3:
        uVar8 = pcVar5[2] * 0x10000 + uVar8;
      case 2:
        uVar8 = pcVar5[1] * 0x100 + uVar8;
      case 1:
        uVar8 = (int)*pcVar5 + uVar8;
      }
      uVar6 = uVar10 >> 0xd ^ (uVar8 - uVar10) - uVar12;
      uVar12 = uVar6 << 8 ^ (uVar12 - uVar10) - uVar6;
      uVar10 = uVar12 >> 0xd ^ (uVar10 - uVar6) - uVar12;
      uVar8 = uVar10 >> 0xc ^ (uVar6 - uVar12) - uVar10;
      uVar6 = uVar8 << 0x10 ^ (uVar12 - uVar10) - uVar8;
      uVar10 = uVar6 >> 5 ^ (uVar10 - uVar8) - uVar6;
      uVar8 = uVar10 >> 3 ^ (uVar8 - uVar6) - uVar10;
      uVar6 = uVar8 << 10 ^ (uVar6 - uVar10) - uVar8;
      pUVar2 = (pkVar1->hh).tbl;
      pUVar3 = pUVar2->buckets[pUVar2->num_buckets - 1 & (uVar6 >> 0xf ^ uVar10 - (uVar8 + uVar6))].
               hh_head;
      if (pUVar3 != (UT_hash_handle *)0x0) {
        pkVar15 = (ktxHashListEntry *)((long)pUVar3 - pUVar2->hho);
        while (((pkVar15->hh).keylen != uVar14 ||
               (iVar7 = bcmp((pkVar15->hh).key,key,sVar4 & 0xffffffff), iVar7 != 0))) {
          pUVar3 = (pkVar15->hh).hh_next;
          if (pUVar3 == (UT_hash_handle *)0x0) {
            return KTX_NOT_FOUND;
          }
          pkVar15 = (ktxHashListEntry *)((long)pUVar3 - pUVar2->hho);
        }
        *ppEntry = pkVar15;
        kVar9 = KTX_SUCCESS;
      }
    }
  }
  return kVar9;
}

Assistant:

KTX_error_code
ktxHashList_FindEntry(ktxHashList* pHead, const char* key,
                      ktxHashListEntry** ppEntry)
{
    if (pHead && key) {
        ktxKVListEntry* kv;

        HASH_FIND_STR( *pHead, key, kv );  /* kv: output pointer */

        if (kv) {
            *ppEntry = kv;
            return KTX_SUCCESS;
        } else
            return KTX_NOT_FOUND;
    } else
        return KTX_INVALID_VALUE;
}